

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int close_connect_only(Curl_easy *data,connectdata *conn,void *param)

{
  void *param_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((data->state).lastconnect_id == conn->connection_id) {
    if (conn->connect_only == '\0') {
      data_local._4_4_ = 1;
    }
    else {
      Curl_conncontrol(conn,1);
      data_local._4_4_ = 1;
    }
  }
  else {
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int close_connect_only(struct Curl_easy *data,
                              struct connectdata *conn, void *param)
{
  (void)param;
  if(data->state.lastconnect_id != conn->connection_id)
    return 0;

  if(!conn->connect_only)
    return 1;

  connclose(conn, "Removing connect-only easy handle");

  return 1;
}